

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisNodeHandlerRexW
          (ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (context == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xfd2,
                  "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                 );
  }
  if (instruction != (ZydisDecodedInstruction *)0x0) {
    if (index == (ZyanU16 *)0x0) {
      __assert_fail("index",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xfd4,
                    "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                   );
    }
    switch(instruction->encoding) {
    case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xfe8,
                    "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                   );
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
      if ((instruction->attributes & 8) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 3)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfdc,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      break;
    case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
      if ((instruction->attributes & 0x10) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfdf,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      break;
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
      if ((instruction->attributes & 0x20) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfe2,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      break;
    case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
      if ((instruction->attributes & 0x40) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfe5,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
    }
    *index = (ushort)(context->vector_unified).W;
    return 0x100000;
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0xfd3,
                "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
               );
}

Assistant:

static ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext* context,
    const ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        // nothing to do here
        break;
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_XOP);
        break;
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_VEX);
        break;
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_EVEX);
        break;
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_MVEX);
        break;
    default:
        ZYAN_UNREACHABLE;
    }
    *index = context->vector_unified.W;
    return ZYAN_STATUS_SUCCESS;
}